

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int http_write(HTTP_INFO *hi,char *data,int len)

{
  int len_00;
  int iVar1;
  char str [10];
  
  printf("22222https_write %s \n");
  if (len < 1 || hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  if ((hi->request).chunked == '\x01') {
    len_00 = snprintf(str,10,"%x\r\n",(ulong)(uint)len);
    iVar1 = https_write(hi,str,len_00);
    if (iVar1 != len_00) goto LAB_00111e04;
  }
  iVar1 = https_write(hi,data,len);
  if (iVar1 == len) {
    if ((hi->request).chunked != '\x01') {
      return len;
    }
    iVar1 = https_write(hi,"\r\n",2);
    if (iVar1 == 2) {
      return len;
    }
  }
LAB_00111e04:
  https_close(hi);
  _error = iVar1;
  return -1;
}

Assistant:

int http_write(HTTP_INFO *hi, char *data, int len)
{
printf("22222https_write %s \n", data);
    char        str[10];
    int         ret, l;


    if(NULL == hi || len <= 0) return -1;

    if(hi->request.chunked == TRUE)
    {
        l = snprintf(str, 10, "%x\r\n", len);

        if ((ret = https_write(hi, str, l)) != l)
        {
            https_close(hi);
            _error = ret;

            return -1;
        }
    }

    if((ret = https_write(hi, data, len)) != len)
    {
        https_close(hi);
        _error = ret;

        return -1;
    }

    if(hi->request.chunked == TRUE)
    {
        if ((ret = https_write(hi, "\r\n", 2)) != 2)
        {
            https_close(hi);
            _error = ret;

            return -1;
        }
    }

    return len;
}